

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O0

char * bc_str_find(char *str,char c)

{
  size_t sVar1;
  long local_28;
  size_t i;
  char c_local;
  char *str_local;
  
  if (str == (char *)0x0) {
    str_local = (char *)0x0;
  }
  else if (c == '\0') {
    sVar1 = strlen(str);
    str_local = str + sVar1;
  }
  else {
    for (local_28 = 0; str[local_28] != '\0'; local_28 = local_28 + 1) {
      if (str[local_28] == '\\') {
        local_28 = local_28 + 1;
      }
      else if (str[local_28] == c) {
        return str + local_28;
      }
    }
    str_local = (char *)0x0;
  }
  return str_local;
}

Assistant:

char*
bc_str_find(const char *str, char c)
{
    // this is somewhat similar to strchr, but respects '\' escaping.
    if (str == NULL)
        return NULL;
    if (c == '\0')
        return (char*) str + strlen(str);
    for (size_t i = 0; str[i] != '\0'; i++) {
        if (str[i] == '\\') {
            i++;
            continue;
        }
        if (str[i] == c) {
            return (char*) str + i;
        }
    }
    return NULL;
}